

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::TruncCase::getInputValues(TruncCase *this,int numValues,void **values)

{
  pointer pSVar1;
  deUint32 dVar2;
  uint uVar3;
  int iVar4;
  Float<unsigned_int,_8,_23,_127,_3U> FVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  Random rnd;
  Float<unsigned_short,_5,_10,_15,_3U> local_4a;
  float local_48 [6];
  deRandom local_30;
  
  local_48[0] = -2.0;
  local_48[1] = 2.0;
  local_48[2] = -1000.0;
  local_48[3] = 1000.0;
  local_48[4] = -1e+07;
  local_48[5] = 1e+07;
  dVar2 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&local_30,dVar2 ^ 0xac23f);
  pSVar1 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (ulong)(pSVar1->varType).m_data.basic.precision;
  uVar3 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  iVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  for (lVar7 = 0; uVar9 = uVar6, iVar8 = iVar4, lVar7 != 6; lVar7 = lVar7 + 1) {
    while (bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
      *(undefined4 *)((long)*values + (long)iVar8 * 4) = (&DAT_018a99e0)[lVar7];
      iVar8 = iVar8 + 1;
    }
    iVar4 = iVar4 + uVar3;
  }
  fillRandomScalars<float>
            ((Random *)&local_30,local_48[uVar10 * 2],local_48[uVar10 * 2 + 1],
             (void *)((long)(int)(uVar3 * 6) * 4 + (long)*values),(numValues + -6) * uVar3,
             (int)uVar6);
  if (uVar10 == 1) {
    uVar10 = 0;
    uVar6 = (ulong)(uVar3 * numValues);
    if ((int)(uVar3 * numValues) < 1) {
      uVar6 = uVar10;
    }
    for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                (&local_4a,*(float *)((long)*values + uVar10 * 4));
      FVar5 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_4a);
      *(StorageType *)((long)*values + uVar10 * 4) = FVar5.m_value;
    }
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd				(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const float				specialCases[]	= { 0.0f, -0.0f, -0.9f, 0.9f, 1.0f, -1.0f };
		const int				numSpecialCases	= DE_LENGTH_OF_ARRAY(specialCases);

		// Special cases
		for (int caseNdx = 0; caseNdx < numSpecialCases; caseNdx++)
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
				((float*)values[0])[caseNdx*scalarSize + scalarNdx] = specialCases[caseNdx];
		}

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + scalarSize*numSpecialCases, (numValues-numSpecialCases)*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}